

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

void __thiscall
dg::pta::LLVMPointerGraphBuilder::LLVMPointerGraphBuilder
          (LLVMPointerGraphBuilder *this,Module *m,LLVMPointerAnalysisOptions *opts)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  undefined6 uVar4;
  
  PointerGraph::PointerGraph(&this->PS);
  (this->mapping).mapping._M_h._M_buckets = &(this->mapping).mapping._M_h._M_single_bucket;
  (this->mapping).mapping._M_h._M_bucket_count = 1;
  (this->mapping).mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mapping).mapping._M_h._M_element_count = 0;
  (this->mapping).mapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mapping).mapping._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mapping).mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->M = m;
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p =
       (pointer)&(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar1 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_options,pcVar1,
             pcVar1 + (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length);
  (this->_options).super_PointerAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       (opts->super_PointerAnalysisOptions).super_AnalysisOptions.fieldSensitivity.offset;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&(this->_options).super_PointerAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t,
             &(opts->super_PointerAnalysisOptions).super_AnalysisOptions.allocationFunctions._M_t);
  bVar3 = (opts->super_PointerAnalysisOptions).invalidateNodes;
  uVar4 = *(undefined6 *)&(opts->super_PointerAnalysisOptions).field_0x3a;
  sVar2 = (opts->super_PointerAnalysisOptions).maxIterations;
  (this->_options).super_PointerAnalysisOptions.preprocessGeps =
       (opts->super_PointerAnalysisOptions).preprocessGeps;
  (this->_options).super_PointerAnalysisOptions.invalidateNodes = bVar3;
  *(undefined6 *)&(this->_options).super_PointerAnalysisOptions.field_0x3a = uVar4;
  (this->_options).super_PointerAnalysisOptions.maxIterations = sVar2;
  (this->_options).analysisType = opts->analysisType;
  (this->_options).threads = opts->threads;
  this->ad_hoc_building = false;
  this->invalidate_nodes = false;
  this->threads_ = opts->threads;
  (this->_funcInfo)._M_h._M_buckets = &(this->_funcInfo)._M_h._M_single_bucket;
  (this->_funcInfo)._M_h._M_bucket_count = 1;
  (this->_funcInfo)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_funcInfo)._M_h._M_element_count = 0;
  (this->_funcInfo)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_funcInfo)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_funcInfo)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nodes_map)._M_h._M_buckets = &(this->nodes_map)._M_h._M_single_bucket;
  (this->nodes_map)._M_h._M_bucket_count = 1;
  (this->nodes_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes_map)._M_h._M_element_count = 0;
  (this->nodes_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->subgraphs_map)._M_h._M_buckets = &(this->subgraphs_map)._M_h._M_single_bucket;
  (this->subgraphs_map)._M_h._M_bucket_count = 1;
  (this->subgraphs_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->subgraphs_map)._M_h._M_element_count = 0;
  (this->subgraphs_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->subgraphs_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->subgraphs_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forkNodes).
  super__Vector_base<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forkNodes).
  super__Vector_base<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->forkNodes).
  super__Vector_base<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->joinNodes).
  super__Vector_base<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->joinNodes).
  super__Vector_base<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->joinNodes).
  super__Vector_base<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

LLVMPointerGraphBuilder(const llvm::Module *m,
                            const LLVMPointerAnalysisOptions &opts)
            : M(m), _options(opts), threads_(opts.threads) {}